

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirmataParser.cpp
# Opt level: O1

void __thiscall firmata::FirmataParser::processSysexMessage(FirmataParser *this)

{
  long lVar1;
  uint8_t uVar2;
  byte bVar3;
  uint8_t *puVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  
  puVar4 = this->dataBuffer;
  uVar2 = *puVar4;
  if (uVar2 != 'q') {
    if (uVar2 != 'y') {
      if (this->currentSysexCallback == (sysexCallbackFunction)0x0) {
        return;
      }
      (*this->currentSysexCallback)
                (this->currentSysexCallbackContext,uVar2,this->sysexBytesRead - 1,puVar4 + 1);
      return;
    }
    if (this->currentReportFirmwareCallback == (versionCallbackFunction)0x0) {
      return;
    }
    uVar6 = this->sysexBytesRead;
    if (uVar6 < 3) {
      (*this->currentReportFirmwareCallback)
                (this->currentReportFirmwareCallbackContext,0,0,(char *)0x0);
      return;
    }
    uVar7 = 3;
    if (uVar6 != 3) {
      do {
        bVar3 = puVar4[uVar7 * 2 + -3];
        puVar4[uVar7] = bVar3;
        puVar4[uVar7] = puVar4[uVar7 * 2 + -2] << 7 | bVar3;
        lVar1 = uVar7 - (uVar6 - 4 >> 1);
        uVar7 = uVar7 + 1;
      } while (lVar1 != 3);
    }
    uVar6 = this->dataBufferSize;
    if (uVar6 <= uVar7) {
      if (this->currentDataBufferOverflowCallback == (dataBufferOverflowCallbackFunction)0x0)
      goto LAB_0010df75;
      this->allowBufferUpdate = true;
      (*this->currentDataBufferOverflowCallback)(this->currentDataBufferOverflowCallbackContext);
      uVar6 = this->dataBufferSize;
    }
    if (uVar7 < uVar6) {
      this->dataBuffer[uVar7] = '\0';
    }
LAB_0010df75:
    puVar4 = this->dataBuffer;
    (*this->currentReportFirmwareCallback)
              (this->currentReportFirmwareCallbackContext,(size_t)puVar4[1],(size_t)puVar4[2],
               (char *)(puVar4 + 3));
    return;
  }
  if (this->currentStringCallback == (stringCallbackFunction)0x0) {
    return;
  }
  sVar5 = this->sysexBytesRead;
  uVar6 = 1;
  if (sVar5 != 1) {
    do {
      bVar3 = puVar4[uVar6 * 2 + -1];
      puVar4[uVar6] = bVar3;
      puVar4[uVar6] = puVar4[uVar6 * 2] << 7 | bVar3;
      lVar1 = uVar6 - (sVar5 - 2 >> 1);
      uVar6 = uVar6 + 1;
    } while (lVar1 != 1);
  }
  uVar7 = this->dataBufferSize;
  if (uVar7 <= uVar6) {
    if (this->currentDataBufferOverflowCallback == (dataBufferOverflowCallbackFunction)0x0)
    goto LAB_0010deb4;
    this->allowBufferUpdate = true;
    (*this->currentDataBufferOverflowCallback)(this->currentDataBufferOverflowCallbackContext);
    uVar7 = this->dataBufferSize;
  }
  if (uVar6 < uVar7) {
    this->dataBuffer[uVar6] = '\0';
  }
LAB_0010deb4:
  (*this->currentStringCallback)(this->currentStringCallbackContext,(char *)(this->dataBuffer + 1));
  return;
}

Assistant:

void FirmataParser::processSysexMessage(void)
{
  switch (dataBuffer[0]) { //first byte in buffer is command
    case REPORT_FIRMWARE:
      if (currentReportFirmwareCallback) {
        const size_t major_version_offset = 1;
        const size_t minor_version_offset = 2;
        const size_t string_offset = 3;
        // Test for malformed REPORT_FIRMWARE message (used to query firmware prior to Firmata v3.0.0)
        if ( 3 > sysexBytesRead ) {
          (*currentReportFirmwareCallback)(currentReportFirmwareCallbackContext, 0, 0, (const char *)NULL);
        } else {
          const size_t end_of_string = (string_offset + decodeByteStream((sysexBytesRead - string_offset), &dataBuffer[string_offset]));
          bufferDataAtPosition('\0', end_of_string); // NULL terminate the string
          (*currentReportFirmwareCallback)(currentReportFirmwareCallbackContext, (size_t)dataBuffer[major_version_offset], (size_t)dataBuffer[minor_version_offset], (const char *)&dataBuffer[string_offset]);
        }
      }
      break;
    case STRING_DATA:
      if (currentStringCallback) {
        const size_t string_offset = 1;
        const size_t end_of_string = (string_offset + decodeByteStream((sysexBytesRead - string_offset), &dataBuffer[string_offset]));
        bufferDataAtPosition('\0', end_of_string); // NULL terminate the string
        (*currentStringCallback)(currentStringCallbackContext, (const char *)&dataBuffer[string_offset]);
      }
      break;
    default:
      if (currentSysexCallback)
        (*currentSysexCallback)(currentSysexCallbackContext, dataBuffer[0], sysexBytesRead - 1, dataBuffer + 1);
  }
}